

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RationalNum.cpp
# Opt level: O0

RationalNum operator+(RationalNum *left,RationalNum *right)

{
  int iVar1;
  long lVar2;
  long local_38;
  longlong tempRD;
  longlong tempLD;
  RationalNum *right_local;
  RationalNum *left_local;
  RationalNum temp;
  
  tempLD = (longlong)right;
  right_local = left;
  RationalNum::RationalNum((RationalNum *)&left_local);
  iVar1 = RationalNum::getDenominator(right_local);
  tempRD = (longlong)iVar1;
  iVar1 = RationalNum::getDenominator((RationalNum *)tempLD);
  local_38 = (long)iVar1;
  simplifyFun(&tempRD,&local_38);
  iVar1 = RationalNum::getDenominator(right_local);
  RationalNum::setDenominator((RationalNum *)&left_local,iVar1 * local_38);
  iVar1 = RationalNum::getNumerator(right_local);
  lVar2 = iVar1 * local_38;
  iVar1 = RationalNum::getNumerator((RationalNum *)tempLD);
  RationalNum::setNumerator((RationalNum *)&left_local,lVar2 + iVar1 * tempRD);
  RationalNum::simplify((RationalNum *)&left_local);
  return _left_local;
}

Assistant:

RationalNum operator+(const RationalNum &left, const RationalNum &right) {
    RationalNum temp;
    long long int tempLD = left.getDenominator();
    long long int tempRD = right.getDenominator();
    simplifyFun(tempLD, tempRD);
    temp.setDenominator(left.getDenominator() * tempRD);
    temp.setNumerator(left.getNumerator() * tempRD + right.getNumerator() * tempLD);
    temp.simplify();
    return temp;
}